

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O1

void __thiscall
Am_Point_List::Insert(Am_Point_List *this,float x,float y,Am_Insert_Position position,bool unique)

{
  Am_Point_Item **ppAVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_Point_Item *pAVar3;
  Am_Point_List_Data *pAVar4;
  Am_Point_List_Data *pAVar5;
  
  pAVar4 = this->data;
  if (pAVar4 == (Am_Point_List_Data *)0x0) {
    pAVar4 = (Am_Point_List_Data *)operator_new(0x20);
    Am_Point_List_Data::Am_Point_List_Data(pAVar4);
  }
  else {
    if ((!unique) || ((pAVar4->super_Am_Wrapper).refs == 1)) goto LAB_001a2cb6;
    iVar2 = (*(pAVar4->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
    pAVar4 = (Am_Point_List_Data *)CONCAT44(extraout_var,iVar2);
    pAVar3 = this->item;
    pAVar5 = pAVar4;
    if (pAVar3 != (Am_Point_Item *)0x0) {
      do {
        pAVar3 = pAVar3->prev;
        ppAVar1 = &pAVar5->head;
        pAVar5 = (Am_Point_List_Data *)*ppAVar1;
      } while (pAVar3 != (Am_Point_Item *)0x0);
      this->item = *ppAVar1;
    }
  }
  this->data = pAVar4;
LAB_001a2cb6:
  Am_Point_List_Data::Insert(this->data,x,y,this->item,position);
  return;
}

Assistant:

void
Am_Point_List::Insert(float x, float y, Am_Insert_Position position,
                      bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Point_List_Data();
  data->Insert(x, y, item, position);
}